

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O1

void __thiscall ser::OffsetTable::Cleanup(OffsetTable *this)

{
  pointer pSVar1;
  pointer pSVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  *p_Var3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  *p_Var4;
  pointer this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  *this_01;
  
  pSVar1 = (this->savepoints_).super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->savepoints_).super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      Savepoint::~Savepoint(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar2);
    (this->savepoints_).super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  p_Var3 = &((this->entries_).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var4 = &((this->entries_).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  this_01 = p_Var3;
  if (p_Var4 != p_Var3) {
    do {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
      ::~_Rb_tree(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != p_Var4);
    (this->entries_).
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var3;
  }
  std::
  _Rb_tree<ser::Savepoint,_std::pair<const_ser::Savepoint,_int>,_std::_Select1st<std::pair<const_ser::Savepoint,_int>_>,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
  ::clear(&(this->savepointIndex_)._M_t);
  return;
}

Assistant:

void OffsetTable::Cleanup()
{
    savepoints_.clear();
    entries_.clear();
    savepointIndex_.clear();
}